

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

bool __thiscall
cmVariableWatchCommand::InitialPass
          (cmVariableWatchCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 *client_data;
  cmake *pcVar4;
  bool bVar5;
  string command;
  string local_1b0;
  ostringstream ostr;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar1) {
    std::__cxx11::string::string
              ((string *)&ostr,"must be called with at least one argument.",(allocator *)&command);
    cmCommand::SetError(&this->super_cmCommand,(string *)&ostr);
    std::__cxx11::string::~string((string *)&ostr);
    return false;
  }
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  if (0x20 < (ulong)((long)pbVar1 - (long)__lhs)) {
    std::__cxx11::string::_M_assign((string *)&command);
  }
  bVar2 = std::operator==(__lhs,"CMAKE_CURRENT_LIST_FILE");
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
    poVar3 = std::operator<<((ostream *)&ostr,"cannot be set on the variable: ");
    std::operator<<(poVar3,(string *)__lhs);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  }
  else {
    client_data = (undefined1 *)operator_new(0x28);
    *(undefined1 **)(client_data + 8) = client_data + 0x18;
    *(undefined8 *)(client_data + 0x10) = 0;
    client_data[0x18] = 0;
    *client_data = 0;
    std::__cxx11::string::_M_assign((string *)(client_data + 8));
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->WatchedVariables,__lhs);
    pcVar4 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    bVar2 = cmVariableWatch::AddWatch
                      (pcVar4->VariableWatch,__lhs,cmVariableWatchCommandVariableAccessed,
                       client_data,deleteVariableWatchCallbackData);
    bVar5 = true;
    if (bVar2) goto LAB_0037a9ec;
    deleteVariableWatchCallbackData(client_data);
  }
  bVar5 = false;
LAB_0037a9ec:
  std::__cxx11::string::~string((string *)&command);
  return bVar5;
}

Assistant:

bool cmVariableWatchCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("must be called with at least one argument.");
    return false;
  }
  std::string const& variable = args[0];
  std::string command;
  if (args.size() > 1) {
    command = args[1];
  }
  if (variable == "CMAKE_CURRENT_LIST_FILE") {
    std::ostringstream ostr;
    ostr << "cannot be set on the variable: " << variable;
    this->SetError(ostr.str());
    return false;
  }

  cmVariableWatchCallbackData* data = new cmVariableWatchCallbackData;

  data->InCallback = false;
  data->Command = command;

  this->WatchedVariables.insert(variable);
  if (!this->Makefile->GetCMakeInstance()->GetVariableWatch()->AddWatch(
        variable, cmVariableWatchCommandVariableAccessed, data,
        deleteVariableWatchCallbackData)) {
    deleteVariableWatchCallbackData(data);
    return false;
  }

  return true;
}